

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointBelief.cpp
# Opt level: O1

void __thiscall JointBelief::Update(JointBelief *this)

{
  Index in_ECX;
  Index in_EDX;
  MultiAgentDecisionProcessDiscreteInterface *in_RSI;
  
  Update((JointBelief *)(&this->field_0x0 + *(long *)(*(long *)this + -200)),in_RSI,in_EDX,in_ECX);
  return;
}

Assistant:

double JointBelief::Update(const MultiAgentDecisionProcessDiscreteInterface &pu,
                           Index lastJAI, Index newJOI)
{
    double Po_ba = 0.0; // P(o|b,a) with o=newJO
    vector<double> newJB_unnorm;
    size_t nrS = pu.GetNrStates();
    
    TGet* T = 0;
    T = pu.GetTGet();
    if(T != 0)
    {
        for(Index sI=0; sI < nrS; sI++)
        {
            double Pso_ba = 0.0;
            if(!pu.GetEventObservability())
            {
                //P(newJOI | lastJAI, sI) :
                double Po_as = pu.GetObservationProbability(lastJAI, sI, newJOI);
                //P(sI | b, a) = sum_(prec_s) P(sI | prec_s, a)*JB(prec_s)
                double Ps_ba = 0.0;
                //for(BScit it=_m_b.begin(); it!=_m_b.end(); ++it)
                //Ps_ba += T->Get(it.index(), lastJAI, sI) * *it;
                for(Index prec_sI=0; prec_sI < nrS; prec_sI++)
                    Ps_ba += T->Get(prec_sI, lastJAI, sI) * _m_b[prec_sI];
                //Ps_ba += pu.GetTransitionProbability(prec_sI, lastJAI, sI) * 
                //_m_b[prec_sI];

                //the new (unormalized) belief P(s,o|b,a)
                Pso_ba = Po_as * Ps_ba;
            }
            else
            {
                for(Index prec_sI=0; prec_sI < nrS; prec_sI++)
                {
                    //P(newJOI | prec_sI, lastJAI, sI) :
                    double Po_sas = pu.GetObservationProbability(prec_sI, lastJAI, sI, newJOI);
                    //P(sI, newJOI | b, a) = sum_(prec_s) P(newJOI | prec_sI, lastJAI, sI)*P(sI | prec_s, a)* JB(prec_s)
                    Pso_ba += Po_sas * T->Get(prec_sI, lastJAI, sI) * _m_b[prec_sI];
                }
            }
            newJB_unnorm.push_back(Pso_ba); //unormalized new belief
            Po_ba += Pso_ba; //running sum of P(o|b,a)
        }
    }
    else 
    {
        for(Index sI=0; sI < nrS; sI++)
        {
            double Pso_ba = 0.0;
            if(!pu.GetEventObservability())
            {
                //P(newJOI | lastJAI, sI) :
                double Po_as = pu.GetObservationProbability(lastJAI, sI, newJOI);
                //P(sI | b, a) = sum_(prec_s) P(sI | prec_s, a)*JB(prec_s)
                double Ps_ba = 0.0;
                //for(BScit it=_m_b.begin(); it!=_m_b.end(); ++it)
                //Ps_ba += T->Get(it.index(), lastJAI, sI) * *it;
                for(Index prec_sI=0; prec_sI < nrS; prec_sI++)
                  Ps_ba += pu.GetTransitionProbability(prec_sI, lastJAI, sI) * 
                    _m_b[prec_sI];
                
                //the new (unormalized) belief P(s,o|b,a)
                Pso_ba = Po_as * Ps_ba;
            }
            else
            {
                for(Index prec_sI=0; prec_sI < nrS; prec_sI++)
                {
                    //P(newJOI | prec_sI, lastJAI, sI) :
                    double Po_sas = pu.GetObservationProbability(prec_sI, lastJAI, sI, newJOI);
                    //P(sI, newJOI | b, a) = sum_(prec_s) P(newJOI | prec_sI, lastJAI, sI)*P(sI | prec_s, a)* JB(prec_s)
                    Pso_ba += Po_sas * pu.GetTransitionProbability(prec_sI, lastJAI, sI) * _m_b[prec_sI];
                }
            }                
            newJB_unnorm.push_back(Pso_ba); //unormalized new belief
            Po_ba += Pso_ba; //running sum of P(o|b,a)
        }
        //throw E("JointBelief::Update tried to obtain a TGet, but apparently the transition model is not cached? (it should be, since this belief update loops over all states it should be possible to cache the transition model)");
    }
   
    //normalize:
    if(Po_ba>0)
        for(Index sI=0; sI < nrS; sI++)
            _m_b[sI]=newJB_unnorm[sI]/Po_ba;

    delete T;

#if JointBelief_doSanityCheckAfterEveryUpdate
    if(!SanityCheck())
        throw(E("JointBelief::Update SanityCheck failed"));
#endif

    return(Po_ba);
}